

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O0

bool __thiscall Jinx::Variant::ConvertTo(Variant *this,ValueType type)

{
  bool bVar1;
  int64_t iVar2;
  element_type *this_00;
  char *pcVar3;
  char *pcVar4;
  Guid *in_RDX;
  undefined4 in_register_00000034;
  double dVar5;
  Allocator<char> local_151;
  String local_150;
  String local_130;
  String local_110;
  ValueType local_f0;
  undefined1 local_ec [4];
  ValueType valType;
  Guid guid;
  CollectionPtr collection;
  int64_t iStack_c0;
  bool boolean;
  int64_t integer;
  double number;
  String local_90;
  String local_70;
  String local_40;
  ValueType local_1c;
  Variant *pVStack_18;
  ValueType type_local;
  Variant *this_local;
  
  if (this->m_type == type) {
    this_local._7_1_ = 1;
    goto LAB_0013149b;
  }
  local_1c = type;
  pVStack_18 = this;
  if (type == Null) {
    SetNull(this);
    this_local._7_1_ = 1;
    goto LAB_0013149b;
  }
  switch(this->m_type) {
  case Null:
    switch(type) {
    case Number:
      dVar5 = Impl::NullToNumber();
      SetNumber(this,dVar5);
      this_local._7_1_ = 1;
      break;
    case Integer:
      iVar2 = Impl::NullToInteger();
      SetInteger(this,iVar2);
      this_local._7_1_ = 1;
      break;
    case Boolean:
      bVar1 = Impl::NullToBoolean();
      SetBoolean(this,bVar1);
      this_local._7_1_ = 1;
      break;
    case String:
      Impl::NullToString_abi_cxx11_();
      SetString(this,&local_40);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string(&local_40);
      this_local._7_1_ = 1;
      break;
    default:
      goto switchD_00130bc5_default;
    }
    goto LAB_0013149b;
  case Number:
    if (type == Integer) {
      iVar2 = Impl::NumberToInteger((this->field_1).m_number);
      SetInteger(this,iVar2);
      this_local._7_1_ = 1;
      goto LAB_0013149b;
    }
    if (type == Boolean) {
      bVar1 = Impl::NumberToBoolean((this->field_1).m_number);
      SetBoolean(this,bVar1);
      this_local._7_1_ = 1;
      goto LAB_0013149b;
    }
    if (type == String) {
      Impl::NumberToString_abi_cxx11_
                (&local_70,(Impl *)CONCAT44(in_register_00000034,type),(this->field_1).m_number);
      SetString(this,&local_70);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string(&local_70);
      this_local._7_1_ = 1;
      goto LAB_0013149b;
    }
    break;
  case Integer:
    if (type == Number) {
      dVar5 = Impl::IntegerToNumber((this->field_1).m_integer);
      SetNumber(this,dVar5);
      this_local._7_1_ = 1;
      goto LAB_0013149b;
    }
    if (type == Boolean) {
      bVar1 = Impl::IntegerToBoolean((this->field_1).m_integer);
      SetBoolean(this,bVar1);
      this_local._7_1_ = 1;
      goto LAB_0013149b;
    }
    if (type == String) {
      Impl::IntegerToString_abi_cxx11_
                (&local_90,
                 (Impl *)(this->field_1).m_collection.
                         super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,(int64_t)in_RDX);
      SetString(this,&local_90);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string(&local_90);
      this_local._7_1_ = 1;
      goto LAB_0013149b;
    }
    break;
  case Boolean:
    if (type == Number) {
      dVar5 = Impl::BooleanToNumber((bool)((this->field_1).m_boolean & 1));
      SetNumber(this,dVar5);
      this_local._7_1_ = 1;
      goto LAB_0013149b;
    }
    if (type == Integer) {
      iVar2 = Impl::BooleanToInteger((bool)((this->field_1).m_boolean & 1));
      SetInteger(this,iVar2);
      this_local._7_1_ = 1;
      goto LAB_0013149b;
    }
    if (type == String) {
      Impl::BooleanToString_abi_cxx11_
                ((String *)&number,(Impl *)(ulong)((this->field_1).m_boolean & 1),SUB81(in_RDX,0));
      SetString(this,(String *)&number);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&number);
      this_local._7_1_ = 1;
      goto LAB_0013149b;
    }
    break;
  case String:
    switch(type) {
    case Number:
      bVar1 = Impl::StringToNumber(&(this->field_1).m_string,(double *)&integer,International);
      if (bVar1) {
        SetNumber(this,(double)integer);
        this_local._7_1_ = 1;
      }
      else {
        pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                 c_str(&(this->field_1).m_string);
        Impl::LogWriteLine(Error,"Error converting string %s to number",pcVar3);
        SetNull(this);
        this_local._7_1_ = 0;
      }
      break;
    case Integer:
      bVar1 = Impl::StringToInteger(&(this->field_1).m_string,&stack0xffffffffffffff40);
      if (bVar1) {
        SetInteger(this,iStack_c0);
        this_local._7_1_ = 1;
      }
      else {
        pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                 c_str(&(this->field_1).m_string);
        Impl::LogWriteLine(Error,"Error converting string %s to integer",pcVar3);
        SetNull(this);
        this_local._7_1_ = 0;
      }
      break;
    case Boolean:
      bVar1 = Impl::StringToBoolean
                        (&(this->field_1).m_string,
                         (bool *)((long)&collection.
                                         super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi + 7));
      if (bVar1) {
        SetBoolean(this,(bool)(collection.
                               super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi._7_1_ & 1));
        this_local._7_1_ = 1;
      }
      else {
        pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                 c_str(&(this->field_1).m_string);
        Impl::LogWriteLine(Error,"Error converting string %s to boolean",pcVar3);
        SetNull(this);
        this_local._7_1_ = 0;
      }
      break;
    default:
      goto switchD_00130bc5_default;
    case Collection:
      CreateCollection();
      bVar1 = Impl::StringToCollection(&(this->field_1).m_string,(CollectionPtr *)(guid.data4 + 4));
      if (bVar1) {
        SetCollection(this,(CollectionPtr *)(guid.data4 + 4));
      }
      else {
        pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                 c_str(&(this->field_1).m_string);
        Impl::LogWriteLine(Error,"Error converting string to collection type",pcVar3);
        SetNull(this);
      }
      guid.data4[0] = '\x01';
      guid.data4[1] = '\0';
      guid.data4[2] = '\0';
      guid.data4[3] = '\0';
      this_local._7_1_ = bVar1;
      std::
      shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
      ::~shared_ptr((shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
                     *)(guid.data4 + 4));
      break;
    case Guid:
      bVar1 = Impl::StringToGuid(&(this->field_1).m_string,(Guid *)local_ec);
      if (bVar1) {
        SetGuid(this,(Guid *)local_ec);
        this_local._7_1_ = 1;
      }
      else {
        pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                 c_str(&(this->field_1).m_string);
        Impl::LogWriteLine(Error,"Error converting string %s to Guid",pcVar3);
        SetNull(this);
        this_local._7_1_ = 0;
      }
      break;
    case ValType:
      bVar1 = Impl::StringToValueType(&(this->field_1).m_string,&local_f0);
      if (bVar1) {
        SetValType(this,local_f0);
        this_local._7_1_ = 1;
      }
      else {
        pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                 c_str(&(this->field_1).m_string);
        Impl::LogWriteLine(Error,"Error converting string %s to value type",pcVar3);
        SetNull(this);
        this_local._7_1_ = 0;
      }
    }
    goto LAB_0013149b;
  case Collection:
    if (type == Boolean) {
      this_00 = std::
                __shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&(this->field_1).m_string);
      bVar1 = std::
              map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>
              ::empty(this_00);
      SetBoolean(this,(bool)((bVar1 ^ 0xffU) & 1));
      this_local._7_1_ = 1;
      goto LAB_0013149b;
    }
    break;
  default:
    break;
  case Function:
    if (type == String) {
      Impl::UnsignedIntegerToString_abi_cxx11_
                (&local_110,
                 (Impl *)(this->field_1).m_collection.
                         super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,(uint64_t)in_RDX);
      SetString(this,&local_110);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string(&local_110);
      this_local._7_1_ = 1;
      goto LAB_0013149b;
    }
    break;
  case Guid:
    if (type == String) {
      Impl::GuidToString_abi_cxx11_(&local_130,(Impl *)&(this->field_1).m_string,in_RDX);
      SetString(this,&local_130);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string(&local_130);
      this_local._7_1_ = 1;
      goto LAB_0013149b;
    }
    break;
  case ValType:
    if (type == String) {
      pcVar3 = Impl::GetValueTypeName((this->field_1).m_valType);
      Allocator<char>::Allocator(&local_151);
      std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
      basic_string<Jinx::Allocator<char>>
                ((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)&local_150,
                 pcVar3,&local_151);
      SetString(this,&local_150);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string(&local_150);
      this_local._7_1_ = 1;
      goto LAB_0013149b;
    }
  }
switchD_00130bc5_default:
  pcVar3 = Impl::GetValueTypeName(this->m_type);
  pcVar4 = Impl::GetValueTypeName(local_1c);
  Impl::LogWriteLine(Error,"Error converting %s to %s",pcVar3,pcVar4);
  SetNull(this);
  this_local._7_1_ = 0;
LAB_0013149b:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline_t bool Variant::ConvertTo(ValueType type)
	{
		if (m_type == type)
			return true;
		if (type == ValueType::Null)
		{
			SetNull();
			return true;
		}

		switch (m_type)
		{
			case ValueType::Null:
			{
				switch (type)
				{
					case ValueType::Number:
						SetNumber(Impl::NullToNumber());
						return true;
					case ValueType::Integer:
						SetInteger(Impl::NullToInteger());
						return true;
					case ValueType::Boolean:
						SetBoolean(Impl::NullToBoolean());
						return true;
					case ValueType::String:
						SetString(Impl::NullToString());
						return true;
					default:
						break;
				};
			}
			break;
			case ValueType::Number:
			{
				switch (type)
				{
					case ValueType::Integer:
						SetInteger(Impl::NumberToInteger(m_number));
						return true;
					case ValueType::Boolean:
						SetBoolean(Impl::NumberToBoolean(m_number));
						return true;
					case ValueType::String:
						SetString(Impl::NumberToString(m_number));
						return true;
					default:
						break;
				};
			}
			break;
			case ValueType::Integer:
			{
				switch (type)
				{
					case ValueType::Number:
						SetNumber(Impl::IntegerToNumber(m_integer));
						return true;
					case ValueType::Boolean:
						SetBoolean(Impl::IntegerToBoolean(m_integer));
						return true;
					case ValueType::String:
						SetString(Impl::IntegerToString(m_integer));
						return true;
					default:
						break;
				};
			}
			break;
			case ValueType::Boolean:
			{
				switch (type)
				{
					case ValueType::Number:
						SetNumber(Impl::BooleanToNumber(m_boolean));
						return true;
					case ValueType::Integer:
						SetInteger(Impl::BooleanToInteger(m_boolean));
						return true;
					case ValueType::String:
						SetString(Impl::BooleanToString(m_boolean));
						return true;
					default:
						break;
				};
			}
			break;
			case ValueType::String:
			{
				switch (type)
				{
					case ValueType::Number:
					{
						double number;
						if (!Impl::StringToNumber(m_string, &number))
						{
							Impl::LogWriteLine(LogLevel::Error, "Error converting string %s to number", m_string.c_str());
							SetNull();
							return false;
						}
						SetNumber(number);
						return true;
					}
					case ValueType::Integer:
					{
						int64_t integer;
						if (!Impl::StringToInteger(m_string, &integer))
						{
							Impl::LogWriteLine(LogLevel::Error, "Error converting string %s to integer", m_string.c_str());
							SetNull();
							return false;
						}
						SetInteger(integer);
						return true;
					}
					case ValueType::Boolean:
					{
						bool boolean;
						if (!Impl::StringToBoolean(m_string, &boolean))
						{
							Impl::LogWriteLine(LogLevel::Error, "Error converting string %s to boolean", m_string.c_str());
							SetNull();
							return false;
						}
						SetBoolean(boolean);
						return true;
					}
					case ValueType::Collection:
					{
						auto collection = CreateCollection();
						if (!Impl::StringToCollection(m_string, &collection))
						{
							Impl::LogWriteLine(LogLevel::Error, "Error converting string to collection type", m_string.c_str());
							SetNull();
							return false;
						}
						SetCollection(collection);
						return true;
					}
					case ValueType::Guid:
					{
						Guid guid;
						if (!Impl::StringToGuid(m_string, &guid))
						{
							Impl::LogWriteLine(LogLevel::Error, "Error converting string %s to Guid", m_string.c_str());
							SetNull();
							return false;
						}
						SetGuid(guid);
						return true;
					}
					case ValueType::ValType:
					{
						ValueType valType;
						if (!Impl::StringToValueType(m_string, &valType))
						{
							Impl::LogWriteLine(LogLevel::Error, "Error converting string %s to value type", m_string.c_str());
							SetNull();
							return false;
						}
						SetValType(valType);
						return true;
					}
					default:
						break;
				};
			}
			break;
			case ValueType::Function:
				switch (type)
				{
					case ValueType::String:
						SetString(Impl::UnsignedIntegerToString(m_function));
						return true;
					default:
						break;
				};
				break;
			case ValueType::Collection:
				switch (type)
				{
					case ValueType::Boolean:
						SetBoolean(!m_collection->empty());
						return true;
					default:
						break;
				};
				break;
			case ValueType::Guid:
				switch (type)
				{
					case ValueType::String:
						SetString(Impl::GuidToString(m_guid));
						return true;
					default:
						break;
				};
				break;
			case ValueType::ValType:
				switch (type)
				{
					case ValueType::String:
						SetString(Impl::GetValueTypeName(m_valType));
						return true;
					default:
						break;
				};
				break;
			default:
				break;
		};
		Impl::LogWriteLine(LogLevel::Error, "Error converting %s to %s", Impl::GetValueTypeName(m_type), Impl::GetValueTypeName(type));
		SetNull();
		return false;
	}